

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O2

Expression * __thiscall
soul::StructuralParser::parseInPlaceOpExpression
          (StructuralParser *this,bool allowAssignment,Expression *lhs,Op opType)

{
  Expression *args_2;
  InPlaceOperator *pIVar1;
  TokenType *args;
  undefined7 in_register_00000031;
  Context context;
  Op local_8c;
  Context local_88;
  Context local_70;
  CompileMessage local_58;
  
  local_8c = opType;
  getContext(&local_70,this);
  if ((int)CONCAT71(in_register_00000031,allowAssignment) != 0) {
    Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
    ::skip(&this->super_SOULTokeniser);
    args_2 = parseExpression(this,false);
    getContext(&local_88,this);
    pIVar1 = allocate<soul::AST::InPlaceOperator,soul::AST::Context,soul::AST::Expression&,soul::AST::Expression&,soul::BinaryOp::Op&>
                       (this,&local_88,lhs,args_2,&local_8c);
    RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr
              ((RefCountedPtr<soul::SourceCodeText> *)&local_88);
    RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr
              ((RefCountedPtr<soul::SourceCodeText> *)&local_70);
    return &pIVar1->super_Expression;
  }
  Errors::inPlaceOperatorMustBeStatement<soul::TokenType&>
            (&local_58,(Errors *)&(this->super_SOULTokeniser).currentType,args);
  AST::Context::throwError(&local_70,&local_58,false);
}

Assistant:

AST::Expression& parseInPlaceOpExpression (bool allowAssignment, AST::Expression& lhs, BinaryOp::Op opType)
    {
        auto context = getContext();

        if (! allowAssignment)
            context.throwError (Errors::inPlaceOperatorMustBeStatement (currentType));

        skip();
        auto& rhs = parseExpression();
        return allocate<AST::InPlaceOperator> (getContext(), lhs, rhs, opType);
    }